

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteIC<std::__cxx11::string,unsigned_long>
          (WalletBatch *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          unsigned_long *value,bool fOverwrite)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DatabaseBatch::Write<std::__cxx11::string,unsigned_long>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,key,value,
                     fOverwrite);
  if (bVar2) {
    (*this->m_database->_vptr_WalletDatabase[10])();
    if ((this->m_database->nUpdateCounter).super___atomic_base<unsigned_int>._M_i % 1000 == 0) {
      (*((this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)->_vptr_DatabaseBatch
        [6])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteIC(const K& key, const T& value, bool fOverwrite = true)
    {
        if (!m_batch->Write(key, value, fOverwrite)) {
            return false;
        }
        m_database.IncrementUpdateCounter();
        if (m_database.nUpdateCounter % 1000 == 0) {
            m_batch->Flush();
        }
        return true;
    }